

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::CheckOpcode3(TypeChecker *this,Opcode opcode)

{
  Result RVar1;
  Info local_60;
  Opcode local_38;
  Type local_34;
  Opcode opcode_local;
  
  local_38.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_60,&local_38);
  local_34 = local_60.param1_type;
  Opcode::GetInfo(&local_60,&local_38);
  Opcode::GetInfo(&local_60,&local_38);
  Opcode::GetInfo(&local_60,&local_38);
  RVar1 = PopAndCheck3Types(this,local_34,local_60.param2_type,local_60.param3_type,local_60.name);
  Opcode::GetInfo(&local_60,&local_38);
  PushType(this,local_60.result_type);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode) {
  Result result =
      PopAndCheck3Types(opcode.GetParamType1(), opcode.GetParamType2(),
                        opcode.GetParamType3(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}